

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall
Json::Reader::parse(Reader *this,char *beginDoc,char *endDoc,Value *root,bool collectComments)

{
  bool bVar1;
  allocator local_69;
  string local_68;
  Token token;
  
  bVar1 = (this->features_).allowComments_;
  this->begin_ = beginDoc;
  this->end_ = endDoc;
  this->collectComments_ = (bool)(collectComments & bVar1);
  this->current_ = beginDoc;
  (this->commentsBefore_)._M_string_length = 0;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  *(this->commentsBefore_)._M_dataplus._M_p = '\0';
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::clear
            (&this->errors_);
  while ((this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
  }
  local_68._M_dataplus._M_p = (pointer)root;
  std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
            ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_68);
  bVar1 = readValue(this);
  skipCommentTokens(this,&token);
  if ((this->collectComments_ == true) && ((this->commentsBefore_)._M_string_length != 0)) {
    Value::setComment(root,&this->commentsBefore_,commentAfter);
  }
  if (((this->features_).strictRoot_ == true) && ((*(ushort *)&root->field_0x8 & 0xfe) != 6)) {
    token.type_ = tokenError;
    token.start_ = beginDoc;
    token.end_ = endDoc;
    std::__cxx11::string::string
              ((string *)&local_68,
               "A valid JSON document must be either an array or an object value.",&local_69);
    addError(this,&local_68,&token,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_68);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Reader::parse(const char* beginDoc,
                   const char* endDoc,
                   Value& root,
                   bool collectComments) {
  if (!features_.allowComments_) {
    collectComments = false;
  }

  begin_ = beginDoc;
  end_ = endDoc;
  collectComments_ = collectComments;
  current_ = begin_;
  lastValueEnd_ = 0;
  lastValue_ = 0;
  commentsBefore_.clear();
  errors_.clear();
  while (!nodes_.empty())
    nodes_.pop();
  nodes_.push(&root);

  bool successful = readValue();
  Token token;
  skipCommentTokens(token);
  if (collectComments_ && !commentsBefore_.empty())
    root.setComment(commentsBefore_, commentAfter);
  if (features_.strictRoot_) {
    if (!root.isArray() && !root.isObject()) {
      // Set error location to start of doc, ideally should be first token found
      // in doc
      token.type_ = tokenError;
      token.start_ = beginDoc;
      token.end_ = endDoc;
      addError(
          "A valid JSON document must be either an array or an object value.",
          token);
      return false;
    }
  }
  return successful;
}